

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_eval.c
# Opt level: O0

l2_expr_info * l2_eval_expr_single(l2_expr_info *__return_storage_ptr__,l2_scope *scope_p)

{
  l2_token *plVar1;
  boolean bVar2;
  l2_token *local_98;
  _val_union _Stack_90;
  l2_token *local_80;
  _val_union _Stack_78;
  l2_token *local_68;
  _val_union _Stack_60;
  l2_token *local_50;
  l2_token *current_token_p;
  l2_expr_info right_expr_info;
  undefined4 local_28;
  undefined4 uStack_24;
  l2_expr_info res_expr_info;
  l2_scope *scope_p_local;
  
  bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_LOGIC_NOT);
  if (bVar2 == '\0') {
    bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_BIT_NOT);
    if (bVar2 == '\0') {
      bVar2 = l2_parse_probe_next_token_by_type(L2_TOKEN_SUB);
      if (bVar2 == '\0') {
        l2_eval_expr_atom(__return_storage_ptr__,scope_p);
      }
      else {
        l2_parse_token_forward();
        local_50 = l2_parse_token_current();
        l2_eval_expr_single((l2_expr_info *)&local_98,scope_p);
        right_expr_info.val.real = _Stack_90._8_8_;
        current_token_p = local_98;
        plVar1 = current_token_p;
        right_expr_info._0_8_ = _Stack_90.real;
        current_token_p._0_4_ = (int)local_98;
        if ((int)current_token_p == 2) {
          local_28 = 2;
          res_expr_info._0_8_ = -_Stack_90.integer;
        }
        else {
          if ((int)current_token_p != 3) {
            current_token_p = plVar1;
            if ((int)current_token_p != 4) {
              l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_50->current_line,
                               local_50->current_col);
            }
            l2_parsing_error(L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                             local_50->current_line,local_50->current_col,"-","bool");
          }
          local_28 = 3;
          res_expr_info._0_8_ = -(double)_Stack_90.integer;
        }
        *(ulong *)__return_storage_ptr__ = CONCAT44(uStack_24,local_28);
        (__return_storage_ptr__->val).real = (double)res_expr_info._0_8_;
        (__return_storage_ptr__->val).procedure.upper_scope_p = (l2_scope *)res_expr_info.val.real;
      }
    }
    else {
      l2_parse_token_forward();
      local_50 = l2_parse_token_current();
      l2_eval_expr_single((l2_expr_info *)&local_80,scope_p);
      right_expr_info.val.real = _Stack_78._8_8_;
      current_token_p = local_80;
      plVar1 = current_token_p;
      right_expr_info._0_8_ = _Stack_78.real;
      current_token_p._0_4_ = (int)local_80;
      if ((int)current_token_p != 2) {
        current_token_p = plVar1;
        if ((int)current_token_p == 3) {
          l2_parsing_error(L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                           local_50->current_line,local_50->current_col,"~","real");
        }
        if ((int)current_token_p != 4) {
          l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_50->current_line,
                           local_50->current_col);
        }
        l2_parsing_error(L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                         local_50->current_line,local_50->current_col,"~","bool");
      }
      *(ulong *)__return_storage_ptr__ = CONCAT44(uStack_24,2);
      (__return_storage_ptr__->val).integer = _Stack_78.integer ^ 0xffffffffffffffff;
      (__return_storage_ptr__->val).procedure.upper_scope_p = (l2_scope *)res_expr_info.val.real;
    }
  }
  else {
    l2_parse_token_forward();
    local_50 = l2_parse_token_current();
    l2_eval_expr_single((l2_expr_info *)&local_68,scope_p);
    right_expr_info.val.real = _Stack_60._8_8_;
    current_token_p = local_68;
    plVar1 = current_token_p;
    right_expr_info._0_8_ = _Stack_60.real;
    current_token_p._0_4_ = (int)local_68;
    current_token_p = plVar1;
    if ((int)current_token_p == 2) {
      l2_parsing_error(L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                       local_50->current_line,local_50->current_col,"!","integer");
    }
    if ((int)current_token_p == 3) {
      l2_parsing_error(L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE,
                       local_50->current_line,local_50->current_col,"!","real");
    }
    if ((int)current_token_p != 4) {
      l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE,local_50->current_line,
                       local_50->current_col);
    }
    right_expr_info.val_type._0_1_ = (undefined1)_Stack_60.integer;
    res_expr_info._0_8_ =
         (CONCAT71(res_expr_info._1_7_,(undefined1)right_expr_info.val_type != L2_EXPR_VAL_NOT_EXPR)
         ^ 0xff) & 0xffffffffffffff01;
    *(ulong *)__return_storage_ptr__ = CONCAT44(uStack_24,4);
    (__return_storage_ptr__->val).real = (double)res_expr_info._0_8_;
    (__return_storage_ptr__->val).procedure.upper_scope_p = (l2_scope *)res_expr_info.val.real;
  }
  return __return_storage_ptr__;
}

Assistant:

l2_expr_info l2_eval_expr_single(l2_scope *scope_p) {
    l2_expr_info res_expr_info, right_expr_info;
    _declr_current_token_p

    _if_type (L2_TOKEN_LOGIC_NOT) /* ! */
    {
        _get_current_token_p

        right_expr_info = l2_eval_expr_single(scope_p);
        res_expr_info.val_type = L2_EXPR_VAL_TYPE_BOOL;
        switch (right_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                l2_parsing_error(L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "!", "integer");

            case L2_EXPR_VAL_TYPE_BOOL:
                res_expr_info.val.bool = !(right_expr_info.val.bool);
                break;

            case L2_EXPR_VAL_TYPE_REAL:
                l2_parsing_error(L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "!", "real");

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);

        }
        return res_expr_info;

    }
    _elif_type (L2_TOKEN_BIT_NOT) /* ~ */
    {
        _get_current_token_p

        right_expr_info = l2_eval_expr_single(scope_p);
        res_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
        switch (right_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                res_expr_info.val.integer = ~(right_expr_info.val.integer);
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                l2_parsing_error(L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "~", "bool");

            case L2_EXPR_VAL_TYPE_REAL:
                l2_parsing_error(L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "~", "real");

            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return res_expr_info;

    }
    _elif_type (L2_TOKEN_SUB) /* - */
    {
        _get_current_token_p

        right_expr_info = l2_eval_expr_single(scope_p);
        switch (right_expr_info.val_type) {
            case L2_EXPR_VAL_TYPE_INTEGER:
                res_expr_info.val_type = L2_EXPR_VAL_TYPE_INTEGER;
                res_expr_info.val.integer = -(right_expr_info.val.integer);
                break;

            case L2_EXPR_VAL_TYPE_BOOL:
                l2_parsing_error(L2_PARSING_ERROR_UNITARY_OPERATOR_CONTAINS_INCOMPATIBLE_TYPE, current_token_p->current_line, current_token_p->current_col, "-", "bool");

            case L2_EXPR_VAL_TYPE_REAL:
                res_expr_info.val_type = L2_EXPR_VAL_TYPE_REAL;
                res_expr_info.val.real = -(right_expr_info.val.real);
                break;
                
            default:
                l2_parsing_error(L2_PARSING_ERROR_INCOMPATIBLE_EXPR_TYPE, current_token_p->current_line, current_token_p->current_col);
        }
        return res_expr_info;

    }
    _else
    {
        return l2_eval_expr_atom(scope_p);
    }
}